

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall SmallArray<DelayedType,_32U>::grow(SmallArray<DelayedType,_32U> *this,uint newSize)

{
  undefined4 uVar1;
  DelayedType *pDVar2;
  DelayedType *pDVar3;
  uint local_24;
  DelayedType *pDStack_20;
  uint i;
  DelayedType *newData;
  uint newSize_local;
  SmallArray<DelayedType,_32U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    pDStack_20 = NULLC::construct<DelayedType>(newData._4_4_);
  }
  else {
    pDStack_20 = Allocator::construct<DelayedType>(this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    pDVar3 = this->data + local_24;
    pDVar2 = pDStack_20 + local_24;
    uVar1 = *(undefined4 *)&pDVar3->field_0x4;
    pDVar2->index = pDVar3->index;
    *(undefined4 *)&pDVar2->field_0x4 = uVar1;
    pDVar2->constants = pDVar3->constants;
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<DelayedType>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<DelayedType>(this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = pDStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}